

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

string * __thiscall
deqp::gles2::Performance::binaryOpVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numOperations,char *op)

{
  long *plVar1;
  long *plVar2;
  undefined4 in_register_00000014;
  char *__s;
  int iVar3;
  allocator<char> local_79;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (0 < (int)this) {
    iVar3 = 0;
    do {
      __s = (char *)CONCAT44(in_register_00000014,numOperations);
      if (iVar3 == 0) {
        __s = "";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_79);
      plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_60 = *plVar2;
        lStack_58 = plVar1[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar2;
        local_70 = (long *)*plVar1;
      }
      local_68 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      iVar3 = iVar3 + 1;
    } while ((int)this != iVar3);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string binaryOpVertexTemplate (int numOperations, const char* op)
{
	string resultTemplate;

	resultTemplate +=
		"attribute highp vec4 a_position${NAME_SPEC};\n"
		"attribute mediump vec4 a_value${NAME_SPEC};\n"
		"varying mediump vec4 v_value${NAME_SPEC};\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
		"	mediump vec4 value = ";

	for (int i = 0; i < numOperations; i++)
		resultTemplate += string(i > 0 ? op : "") + "a_value${NAME_SPEC}";

	resultTemplate +=
		";\n"
		"	v_value${NAME_SPEC} = value;\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}